

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O1

void __thiscall
CTPNStmCatch::gen_code_catch(CTPNStmCatch *this,ulong start_prot_ofs,ulong end_prot_ofs)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  CTPNStm *substm;
  CTcGenTarg *pCVar4;
  CTcGenTarg *pCVar5;
  CTcPrsSymtab *symtab;
  CTcSymbol *pCVar6;
  _func_int **exc_obj_id;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  symtab = CTcCodeStream::set_local_frame(G_cs,(this->super_CTPNStmCatchBase).symtab_);
  pCVar6 = CTcPrsSymtab::find_or_def
                     (G_cs->symtab_,(this->super_CTPNStmCatchBase).exc_class_,
                      (this->super_CTPNStmCatchBase).exc_class_len_,0,TCPRS_UNDEF_ADD_UNDEF);
  uVar2 = *(uint *)&(pCVar6->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24
  ;
  exc_obj_id = (_func_int **)(ulong)uVar2;
  if (exc_obj_id != (_func_int **)0x0) {
    if (uVar2 == 2) {
      exc_obj_id = pCVar6[1].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                   _vptr_CVmHashEntry;
    }
    else {
      exc_obj_id = (_func_int **)0x0;
      CTPNStmBase::log_error
                ((CTPNStmBase *)this,0x2d07,
                 (ulong)(uint)(this->super_CTPNStmCatchBase).exc_class_len_,
                 (this->super_CTPNStmCatchBase).exc_class_);
    }
  }
  CTcT3ExcTable::add_catch
            (&G_cg->exc_table_,start_prot_ofs,end_prot_ofs,(ulong)exc_obj_id,
             (G_cs->super_CTcDataStream).ofs_);
  pCVar4 = G_cg;
  pCVar4->last_op_ = 0xf2;
  pCVar5 = G_cg;
  pCVar4->second_last_op_ = 0xf2;
  iVar3 = G_cg->sp_depth_;
  iVar1 = iVar3 + 1;
  G_cg->sp_depth_ = iVar1;
  if (pCVar5->max_sp_depth_ <= iVar3) {
    pCVar5->max_sp_depth_ = iVar1;
  }
  CTcSymLocal::gen_code_setlcl((this->super_CTPNStmCatchBase).exc_var_);
  substm = (this->super_CTPNStmCatchBase).body_;
  if (substm != (CTPNStm *)0x0) {
    CTPNStmBase::gen_code_substm((CTPNStmBase *)this,substm);
  }
  CTcCodeStream::set_local_frame(G_cs,symtab);
  return;
}

Assistant:

void CTPNStmCatch::gen_code_catch(ulong start_prot_ofs, ulong end_prot_ofs)
{
    CTcSymbol *sym;
    ulong exc_obj_id;
    CTcPrsSymtab *old_frame;

    /* add the source location of the 'catch' clause */
    add_debug_line_rec();

    /* set the local scope */
    old_frame = G_cs->set_local_frame(symtab_);

    /* look up the object defining the class of exceptions to catch */
    sym = G_cs->get_symtab()->find_or_def_undef(exc_class_,
                                                exc_class_len_, FALSE);

    /* assume we won't find a valid object ID */
    exc_obj_id = VM_INVALID_OBJ;

    /* if it's an object, get its ID */
    if (sym->get_type() == TC_SYM_OBJ)
    {
        /* get its object ID */
        exc_obj_id = ((CTcSymObj *)sym)->get_obj_id();
    }
    else if (sym->get_type() != TC_SYM_UNKNOWN)
    {
        /* 
         *   it's defined, but it's not an object - log an error (note
         *   that we don't log an error if the symbol is undefined,
         *   because find_or_def_undef() will already have logged an error
         *   for us) 
         */
        log_error(TCERR_CATCH_EXC_NOT_OBJ, (int)exc_class_len_, exc_class_);
    }

    /* add our exception table entry */
    G_cg->get_exc_table()->add_catch(start_prot_ofs, end_prot_ofs,
                                     exc_obj_id, G_cs->get_ofs());

    /* don't allow any peephole optimizations to affect this offset */
    G_cg->clear_peephole();

    /* 
     *   the VM automatically pushes a value onto the stack to perform the
     *   'catch' 
     */
    G_cg->note_push();

    /* 
     *   generate a SETLCL for our formal parameter, so that the exception
     *   object is stored in our local variable
     */
    exc_var_->gen_code_setlcl();
    
    /* generate code for our statement, if we have one */
    if (body_ != 0)
        gen_code_substm(body_);

    /* restore the enclosing local scope */
    G_cs->set_local_frame(old_frame);
}